

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

void __thiscall
particleSamples::filter_particles_into_lists
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *full_list)

{
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *pvVar1;
  iterator iVar2;
  pointer paVar3;
  vector<particle_info,std::allocator<particle_info>> *pvVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  anon_struct_120_15_f999644b *paVar12;
  particleSamples *this_00;
  iterator iVar13;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  pointer ppvVar14;
  anon_struct_120_15_f999644b *part_i;
  pointer __args;
  char cVar15;
  byte bVar16;
  vector<particle_info,_std::allocator<particle_info>_> *local_40;
  pointer local_38;
  
  bVar16 = 0;
  this_00 = this;
  clear_out_previous_record(this,this->particle_list);
  if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
    clear_out_previous_record(this_00,this->resonance_list_Sigma0);
  }
  if (this->net_particle_flag == 1) {
    clear_out_previous_record(this_00,this->anti_particle_list);
  }
  if (this->reconst_flag == 1) {
    clear_out_previous_record(this_00,this->reconst_list_1);
    clear_out_previous_record(this_00,this->reconst_list_2);
  }
  if (this->flag_charge_dependence == 1) {
    clear_out_previous_record(this_00,this->positive_charge_hadron_list);
    clear_out_previous_record(this_00,this->negative_charge_hadron_list);
  }
  if (this->analyze_BF == true) {
    clear_out_previous_record(this_00,this->balance_function_particle_a);
    clear_out_previous_record(this_00,this->balance_function_particle_abar);
    clear_out_previous_record(this_00,this->balance_function_particle_b);
    clear_out_previous_record(this_00,this->balance_function_particle_bbar);
  }
  ppvVar14 = (full_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (full_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppvVar14 != local_38) {
    lVar11 = 0;
    do {
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->particle_list;
      local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
      if (iVar2._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (pvVar1,iVar2,&local_40);
      }
      else {
        *iVar2._M_current = local_40;
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
      }
      if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->resonance_list_Sigma0;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
      }
      if (this->net_particle_flag == 1) {
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->anti_particle_list;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
      }
      if (this->reconst_flag == 1) {
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->reconst_list_1;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->reconst_list_2;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
      }
      if (this->flag_charge_dependence == 1) {
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->positive_charge_hadron_list;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->negative_charge_hadron_list;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
      }
      if (this->analyze_BF == true) {
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->balance_function_particle_a;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->balance_function_particle_abar;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->balance_function_particle_b;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)this->balance_function_particle_bbar;
        local_40 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_40->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar2._M_current = *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 8);
        if (iVar2._M_current ==
            *(vector<particle_info,_std::allocator<particle_info>_> ***)(pvVar1 + 0x10)) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    (pvVar1,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
      }
      paVar3 = ((*ppvVar14)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (__args = ((*ppvVar14)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)
                    ._M_impl.super__Vector_impl_data._M_start; __args != paVar3; __args = __args + 1
          ) {
        bVar6 = decide_to_pick_OSCAR(this,this->particle_monval,__args->monval);
        if (bVar6) {
          pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                   (this->particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar11];
          iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
          if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
          }
          else {
            paVar12 = __args;
            for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
              uVar5 = *(undefined4 *)&paVar12->field_0x4;
              (iVar13._M_current)->monval = paVar12->monval;
              *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
              paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8);
              iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
            }
            *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
          }
        }
        if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
          if (this->particle_monval == 0xc32) {
            if (__args->monval == 0xc8c) {
LAB_0011b53e:
              pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                       (this->resonance_list_Sigma0->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar11];
              iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
              if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
                std::vector<particle_info,std::allocator<particle_info>>::
                _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
              }
              else {
                paVar12 = __args;
                for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
                  uVar5 = *(undefined4 *)&paVar12->field_0x4;
                  (iVar13._M_current)->monval = paVar12->monval;
                  *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
                  paVar12 = (anon_struct_120_15_f999644b *)
                            ((long)paVar12 + (ulong)bVar16 * -0x10 + 8);
                  iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
                }
                *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
              }
            }
          }
          else if (__args->monval == -0xc8c && this->particle_monval == -0xc32) goto LAB_0011b53e;
        }
        if (this->reconst_flag == 1) {
          cVar15 = __args->monval == 0x141;
          if (__args->monval == -0x141) {
            cVar15 = '\x02';
          }
          if (this->particle_monval != 0x14d) {
            cVar15 = '\0';
          }
          if (cVar15 == '\x02') {
            pvVar8 = this->reconst_list_2;
          }
          else {
            if (cVar15 != '\x01') goto LAB_0011b5f8;
            pvVar8 = this->reconst_list_1;
          }
          pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                   (pvVar8->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar11];
          iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
          if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
          }
          else {
            paVar12 = __args;
            for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
              uVar5 = *(undefined4 *)&paVar12->field_0x4;
              (iVar13._M_current)->monval = paVar12->monval;
              *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
              paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8);
              iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
            }
            *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
          }
        }
LAB_0011b5f8:
        if ((this->net_particle_flag == 1) &&
           (iVar7 = decide_to_pick_anti_particles(this,__args->monval), iVar7 != 0)) {
          pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                   (this->anti_particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar11];
          iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
          if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
          }
          else {
            paVar12 = __args;
            for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
              uVar5 = *(undefined4 *)&paVar12->field_0x4;
              (iVar13._M_current)->monval = paVar12->monval;
              *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
              paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8);
              iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
            }
            *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
          }
        }
        if (this->flag_charge_dependence == 1) {
          iVar7 = particle_decay::get_particle_charge(this->decayer_ptr,__args->monval);
          uVar9 = (uint)(iVar7 != 0);
          if (iVar7 < 0) {
            uVar9 = 0xffffffff;
          }
          if (uVar9 == 0xffffffff) {
            pvVar8 = this->negative_charge_hadron_list;
          }
          else {
            if (uVar9 != 1) goto LAB_0011b6b6;
            pvVar8 = this->positive_charge_hadron_list;
          }
          pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                   (pvVar8->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar11];
          iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
          if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
          }
          else {
            paVar12 = __args;
            for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
              uVar5 = *(undefined4 *)&paVar12->field_0x4;
              (iVar13._M_current)->monval = paVar12->monval;
              *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
              paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8);
              iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
            }
            *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
          }
        }
LAB_0011b6b6:
        if (this->analyze_BF == true) {
          bVar6 = decide_to_pick_OSCAR(this,this->particle_monval_a,__args->monval);
          if (bVar6) {
            pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                     (this->balance_function_particle_a->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11];
            iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
            if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
            }
            else {
              paVar12 = __args;
              for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
                uVar5 = *(undefined4 *)&paVar12->field_0x4;
                (iVar13._M_current)->monval = paVar12->monval;
                *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
                paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8)
                ;
                iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
              }
              *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
            }
          }
          bVar6 = decide_to_pick_OSCAR(this,this->particle_monval_abar,__args->monval);
          if (bVar6) {
            pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                     (this->balance_function_particle_abar->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11];
            iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
            if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
            }
            else {
              paVar12 = __args;
              for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
                uVar5 = *(undefined4 *)&paVar12->field_0x4;
                (iVar13._M_current)->monval = paVar12->monval;
                *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
                paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8)
                ;
                iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
              }
              *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
            }
          }
          bVar6 = decide_to_pick_OSCAR(this,this->particle_monval_b,__args->monval);
          if (bVar6) {
            pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                     (this->balance_function_particle_b->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11];
            iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
            if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
            }
            else {
              paVar12 = __args;
              for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
                uVar5 = *(undefined4 *)&paVar12->field_0x4;
                (iVar13._M_current)->monval = paVar12->monval;
                *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
                paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8)
                ;
                iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
              }
              *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
            }
          }
          bVar6 = decide_to_pick_OSCAR(this,this->particle_monval_bbar,__args->monval);
          if (bVar6) {
            pvVar4 = (vector<particle_info,std::allocator<particle_info>> *)
                     (this->balance_function_particle_bbar->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11];
            iVar13._M_current = *(anon_struct_120_15_f999644b **)(pvVar4 + 8);
            if (iVar13._M_current == *(anon_struct_120_15_f999644b **)(pvVar4 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(pvVar4,iVar13,__args);
            }
            else {
              paVar12 = __args;
              for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
                uVar5 = *(undefined4 *)&paVar12->field_0x4;
                (iVar13._M_current)->monval = paVar12->monval;
                *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar5;
                paVar12 = (anon_struct_120_15_f999644b *)((long)paVar12 + (ulong)bVar16 * -0x10 + 8)
                ;
                iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -0x10 + 8;
              }
              *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x78;
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      ppvVar14 = ppvVar14 + 1;
    } while (ppvVar14 != local_38);
  }
  return;
}

Assistant:

void particleSamples::filter_particles_into_lists(
    vector<vector<particle_info> *> *full_list) {
    // clean out the previous record
    clear_out_previous_record(particle_list);

    if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1)
        clear_out_previous_record(resonance_list_Sigma0);

    if (net_particle_flag == 1) clear_out_previous_record(anti_particle_list);

    if (reconst_flag == 1) {
        clear_out_previous_record(reconst_list_1);
        clear_out_previous_record(reconst_list_2);
    }

    if (flag_charge_dependence == 1) {
        clear_out_previous_record(positive_charge_hadron_list);
        clear_out_previous_record(negative_charge_hadron_list);
    }

    if (analyze_BF) {
        clear_out_previous_record(balance_function_particle_a);
        clear_out_previous_record(balance_function_particle_abar);
        clear_out_previous_record(balance_function_particle_b);
        clear_out_previous_record(balance_function_particle_bbar);
    }

    int iev = 0;
    for (auto &ev_i : (*full_list)) {
        particle_list->push_back(new vector<particle_info>);
        if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1)
            resonance_list_Sigma0->push_back(new vector<particle_info>);

        if (net_particle_flag == 1)
            anti_particle_list->push_back(new vector<particle_info>);

        if (reconst_flag == 1) {
            reconst_list_1->push_back(new vector<particle_info>);
            reconst_list_2->push_back(new vector<particle_info>);
        }

        if (flag_charge_dependence == 1) {
            positive_charge_hadron_list->push_back(new vector<particle_info>);
            negative_charge_hadron_list->push_back(new vector<particle_info>);
        }

        if (analyze_BF) {
            balance_function_particle_a->push_back(new vector<particle_info>);
            balance_function_particle_abar->push_back(
                new vector<particle_info>);
            balance_function_particle_b->push_back(new vector<particle_info>);
            balance_function_particle_bbar->push_back(
                new vector<particle_info>);
        }

        for (auto &part_i : (*ev_i)) {
            bool pick_flag =
                decide_to_pick_OSCAR(particle_monval, part_i.monval);
            if (pick_flag) {
                (*particle_list)[iev]->push_back(part_i);
            }

            if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
                int resonance_pick_flag =
                    decide_to_pick_resonance(part_i.monval);
                if (resonance_pick_flag == 1)
                    (*resonance_list_Sigma0)[iev]->push_back(part_i);
            }

            if (reconst_flag == 1) {
                int reconst_pick_flag = decide_to_pick_reconst(part_i.monval);
                if (reconst_pick_flag == 1)
                    (*reconst_list_1)[iev]->push_back(part_i);
                else if (reconst_pick_flag == 2)
                    (*reconst_list_2)[iev]->push_back(part_i);
            }
            if (net_particle_flag == 1) {
                int anti_particle_pick_flag =
                    decide_to_pick_anti_particles(part_i.monval);
                if (anti_particle_pick_flag == 1)
                    (*anti_particle_list)[iev]->push_back(part_i);
            }

            if (flag_charge_dependence == 1) {
                int charge_flag = decide_to_pick_charge(part_i.monval);
                if (charge_flag == 1)
                    (*positive_charge_hadron_list)[iev]->push_back(part_i);
                else if (charge_flag == -1)
                    (*negative_charge_hadron_list)[iev]->push_back(part_i);
            }

            if (analyze_BF) {
                if (decide_to_pick_OSCAR(particle_monval_a, part_i.monval))
                    (*balance_function_particle_a)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_abar, part_i.monval))
                    (*balance_function_particle_abar)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_b, part_i.monval))
                    (*balance_function_particle_b)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_bbar, part_i.monval))
                    (*balance_function_particle_bbar)[iev]->push_back(part_i);
            }
        }
        iev++;
    }
}